

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O3

int recvsimplehttpresp(SOCKET sock,int *pStatus,char **pszStatus,char **pContentType,
                      int *pContentLength,char **pContent,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ssize_t sVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  double httpver;
  undefined8 local_38;
  
  uVar7 = 0;
  local_38 = 0;
  *pStatus = 0;
  *pszStatus = (char *)0x0;
  *pContentType = (char *)0x0;
  *pContentLength = 0;
  *pContent = (char *)0x0;
  *pBytesReceived = 0;
  pcVar2 = (char *)calloc((long)(maxrecvbuflen + 1),1);
  iVar1 = 6;
  if (pcVar2 != (char *)0x0) {
    do {
      iVar6 = (int)uVar7;
      if ((0 < iVar6) && (pcVar3 = strstr(pcVar2,"\r\n\r\n"), pcVar3 != (char *)0x0)) {
        *pBytesReceived = iVar6;
        pcVar3 = strstr(pcVar2,"HTTP/");
        if (pcVar3 != (char *)0x0) {
          pcVar5 = (char *)calloc(0x100,1);
          *pszStatus = pcVar5;
          if (pcVar5 == (char *)0x0) goto LAB_001671c3;
          iVar1 = __isoc99_sscanf(pcVar3,"HTTP/%lf %d %[^\r\n]255s",&local_38,pStatus,pcVar5);
          if (iVar1 == 3) {
            pcVar3 = strstr(pcVar3,"Content-Type: ");
            if (pcVar3 != (char *)0x0) {
              pcVar3 = pcVar3 + 0xe;
              pcVar5 = strstr(pcVar3,"\r\n");
              if ((pcVar5 != (char *)0x0) && (uVar8 = (int)pcVar5 - (int)pcVar3, -1 < (int)uVar8)) {
                pcVar5 = (char *)calloc((ulong)(uVar8 + 1),1);
                *pContentType = pcVar5;
                if (pcVar5 == (char *)0x0) {
                  free(*pszStatus);
LAB_001671c3:
                  free(pcVar2);
                  return 6;
                }
                memcpy(pcVar5,pcVar3,(ulong)(uVar8 & 0x7fffffff));
                pcVar3 = strstr(pcVar2,"Content-Length: ");
                if (pcVar3 == (char *)0x0) {
                  free(pcVar5);
                  free(*pszStatus);
                  free(pcVar2);
                  return 0;
                }
                iVar1 = __isoc99_sscanf(pcVar3,"Content-Length: %d",pContentLength);
                if (iVar1 == 1) {
                  uVar8 = *pContentLength;
                  if (-1 < (int)uVar8) {
                    free(pcVar2);
                    pcVar2 = (char *)calloc((ulong)uVar8 + 1,1);
                    *pContent = pcVar2;
                    if (pcVar2 == (char *)0x0) {
                      free(*pContentType);
                      pcVar2 = *pszStatus;
                      goto LAB_001671c3;
                    }
                    iVar1 = recvall(sock,pcVar2,uVar8);
                    if (iVar1 == 0) {
                      *pBytesReceived = *pBytesReceived + *pContentLength;
                      return 0;
                    }
                    free(*pContent);
                    free(*pContentType);
                    pcVar2 = *pszStatus;
                    goto LAB_00167008;
                  }
                }
                free(*pContentType);
              }
            }
            pcVar3 = *pszStatus;
          }
          else {
            pcVar3 = *pszStatus;
          }
          free(pcVar3);
        }
        free(pcVar2);
        return 4;
      }
      if (maxrecvbuflen <= iVar6) {
        iVar1 = 6;
        goto LAB_00166ffd;
      }
      sVar4 = recv(sock,pcVar2 + uVar7,1,0);
      iVar1 = (int)sVar4;
      if (iVar1 < 0) {
        iVar1 = 1;
        goto LAB_00166ffd;
      }
      uVar7 = (ulong)(uint)(iVar6 + iVar1);
    } while (iVar1 != 0);
    iVar1 = 2;
LAB_00166ffd:
    *pBytesReceived = iVar6;
LAB_00167008:
    free(pcVar2);
  }
  return iVar1;
}

Assistant:

inline int recvsimplehttpresp(SOCKET sock, int* pStatus, char** pszStatus, char** pContentType, int* pContentLength, char** pContent, int maxrecvbuflen, int* pBytesReceived)
{
	int ret = EXIT_FAILURE;
	char* recvbuf = NULL;
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	double httpver = 0;

	*pStatus = 0;
	*pszStatus = NULL;
	*pContentType = NULL;
	*pContentLength = 0;
	*pContent = NULL;
	*pBytesReceived = 0;

	recvbuf = (char*)calloc(maxrecvbuflen+1, 1);
	if (recvbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		return EXIT_OUT_OF_MEMORY;
	}

	// Should enable other line endings...

	ret = recvuntilstr(sock, recvbuf, "\r\n\r\n", maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(recvbuf);
		return ret;
	}

	ptr = strstr(recvbuf, "HTTP/");
	if (ptr == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pszStatus = (char*)calloc(256, 1);
	if (*pszStatus == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	if (sscanf(ptr, "HTTP/%lf %d %[^\r\n]255s", &httpver, pStatus, *pszStatus) != 3)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	if (strstrbeginend(ptr, "Content-Type: ", "\r\n", &ptr2, &count) == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pContentType = (char*)calloc(count+1, 1);
	if (*pContentType == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(*pContentType, ptr2, count);

	ptr = strstr(recvbuf, "Content-Length: ");
	if (ptr == NULL)
	{
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_SUCCESS;
	}
	
	if ((sscanf(ptr, "Content-Length: %d", pContentLength) != 1)||(*pContentLength < 0))
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}
	
	free(recvbuf);

	*pContent = (char*)calloc(*pContentLength+1, 1);
	if (*pContent == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		return EXIT_OUT_OF_MEMORY;
	}

	ret = recvall(sock, *pContent, *pContentLength);
	if (ret != EXIT_SUCCESS)
	{
		free(*pContent);
		free(*pContentType);
		free(*pszStatus);
		return ret;
	}

	*pBytesReceived += *pContentLength;

	return EXIT_SUCCESS;
}